

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.c
# Opt level: O1

mpc_parser_t * parse_module(mpc_parser_t *declaration)

{
  mpc_parser_t *p;
  mpc_parser_t *pmVar1;
  mpc_parser_t *pmVar2;
  mpc_parser_t *pmVar3;
  mpc_parser_t *pmVar4;
  
  p = mpc_new("module");
  pmVar1 = mpc_string("#pragma once");
  pmVar2 = any_newline();
  pmVar1 = mpc_and(2,mpcf_all_free,pmVar1,pmVar2,free);
  pmVar2 = mpc_char('#');
  pmVar3 = any_newline();
  pmVar3 = mpc_not(pmVar3,free);
  pmVar4 = mpc_any();
  pmVar3 = mpc_and(2,mpcf_snd,pmVar3,pmVar4,free);
  pmVar3 = mpc_many(mpcf_strfold,pmVar3);
  pmVar4 = any_newline();
  pmVar2 = mpc_and(3,mpcf_all_free,pmVar2,pmVar3,pmVar4,free,free);
  pmVar3 = mpc_apply(declaration,apply_declaration);
  pmVar4 = parse_doc_comment();
  pmVar4 = mpc_apply(pmVar4,apply_module_doc_item);
  pmVar2 = mpc_or(3,pmVar2,pmVar3,pmVar4);
  pmVar2 = mpc_strip(pmVar2);
  pmVar2 = mpc_many(fold_items,pmVar2);
  pmVar1 = mpc_and(2,mpcf_snd_free,pmVar1,pmVar2,free);
  pmVar1 = mpc_whole(pmVar1,free_items);
  mpc_define(p,pmVar1);
  return p;
}

Assistant:

mpc_parser_t *parse_module(mpc_parser_t *declaration)
{
    mpc_parser_t *module = mpc_new("module");

    mpc_parser_t *pragma_once = mpc_and(
        2, mpcf_all_free,
        mpc_string("#pragma once"), any_newline(),
        free);

    mpc_parser_t *c_item = mpc_or(
        3,
        include_item(),
        declaration_item(declaration),
        // Intentionally last, as it will otherwise swallow declaration docs
        module_doc_item());
    mpc_parser_t *c_items = mpc_many(fold_items, mpc_strip(c_item));

    mpc_parser_t *content = mpc_and(
        2, mpcf_snd_free,
        pragma_once, c_items,
        free);

    mpc_define(module, mpc_whole(content, free_items));

    return module;
}